

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O1

int __thiscall MovDemuxer::mov_read_udta_string(MovDemuxer *this,MOVAtom atom)

{
  char *pcVar1;
  MOVAtom MVar2;
  uint16_t uVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  mapped_type *pmVar9;
  char str [1024];
  undefined4 local_44c;
  key_type local_448;
  uint8_t local_428 [1024];
  
  MVar2 = atom;
  memset(local_428,0,0x400);
  local_44c = 0;
  if (this->itunes_metadata == 0) {
    uVar3 = IOContextDemuxer::get_be16(&this->super_IOContextDemuxer);
    uVar5 = (uint)uVar3;
    IOContextDemuxer::get_be16(&this->super_IOContextDemuxer);
    atom.size = atom.size + -4;
  }
  else {
    uVar5 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
    uVar6 = IOContextDemuxer::get_le32(&this->super_IOContextDemuxer);
    if (uVar6 != 0x61746164) {
      return 0;
    }
    IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
    IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
    uVar5 = uVar5 - 0x10;
    atom.size = atom.size + -0x10;
  }
  if (atom.size < 0) {
    iVar7 = -1;
  }
  else {
    local_44c._0_3_ = MVar2.type._1_3_;
    uVar6 = 0x3ff;
    if (uVar5 < 0x3ff) {
      uVar6 = uVar5;
    }
    uVar4 = (ushort)atom.size;
    if ((long)(ulong)uVar6 <= atom.size) {
      uVar4 = (ushort)uVar6;
    }
    IOContextDemuxer::get_buffer(&this->super_IOContextDemuxer,local_428,(uint)uVar4);
    local_428[uVar4] = '\0';
    local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
    sVar8 = strlen((char *)&local_44c);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_448,&local_44c,(long)&local_44c + sVar8);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->metaData,&local_448);
    pcVar1 = (char *)pmVar9->_M_string_length;
    strlen((char *)local_428);
    std::__cxx11::string::_M_replace((ulong)pmVar9,0,pcVar1,(ulong)local_428);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
    }
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int MovDemuxer::mov_read_udta_string(MOVAtom atom)
{
    char str[1024]{}, key[4]{0}, language[4]{0};
    unsigned str_size;

    if (itunes_metadata)
    {
        const unsigned data_size = get_be32();
        const unsigned tag = get_le32();
        if (tag == MKTAG('d', 'a', 't', 'a'))
        {
            get_be32();  // type
            get_be32();  // unknown
            str_size = data_size - 16;
            atom.size -= 16;
        }
        else
            return 0;
    }
    else
    {
        str_size = get_be16();  // string length
        ff_mov_lang_to_iso639(get_be16(), language);
        atom.size -= 4;
    }
    if (atom.size < 0)
        return -1;

    key[0] = static_cast<char>(atom.type >> 8);
    key[1] = static_cast<char>(atom.type >> 16);
    key[2] = static_cast<char>(atom.type >> 24);

    str_size = static_cast<uint16_t>(FFMIN(FFMIN((int)(sizeof(str) - 1), str_size), atom.size));
    get_buffer(reinterpret_cast<uint8_t*>(str), str_size);
    str[str_size] = 0;
    metaData[key] = str;
    return 0;
}